

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O3

int do_naming(obj *obj)

{
  boolean bVar1;
  char cVar2;
  char c;
  uint uVar3;
  char *pcVar4;
  void *pvVar5;
  char *planA;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  char *last_resort;
  nh_menuitem *pnVar9;
  int iVar10;
  menulist menu;
  int selected [1];
  char buf [256];
  char title [128];
  char qbuf [128];
  menulist local_240;
  short local_22e;
  int local_22c;
  char local_228 [256];
  char local_128 [128];
  char local_a8 [128];
  
  init_menulist(&local_240);
  if (obj == (obj *)0x0) {
    builtin_strncpy(local_128 + 0x10," to name?",10);
    builtin_strncpy(local_128,"What do you wish",0x10);
    lVar8 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar8 * 0x218);
    }
    lVar8 = (long)local_240.icount;
    local_240.items[lVar8].id = 1;
    local_240.items[lVar8].role = MI_NORMAL;
    local_240.items[lVar8].accel = 'C';
    local_240.items[lVar8].group_accel = '\0';
    local_240.items[lVar8].selected = '\0';
    builtin_strncpy(local_240.items[lVar8].caption,"Name a m",8);
    builtin_strncpy(local_240.items[lVar8].caption + 7,"monster",8);
    local_240.icount = local_240.icount + 1;
    if (local_240.size <= local_240.icount) {
      lVar8 = (long)local_240.size;
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar8 * 0x218);
    }
    local_240.items[local_240.icount].id = 2;
    local_240.items[local_240.icount].role = MI_NORMAL;
    local_240.items[local_240.icount].accel = 'y';
    local_240.items[local_240.icount].group_accel = '\0';
    local_240.items[local_240.icount].selected = '\0';
    builtin_strncpy(local_240.items[local_240.icount].caption,"Name an individu",0x10);
    builtin_strncpy(local_240.items[local_240.icount].caption + 0x10,"al item",8);
    local_240.icount = local_240.icount + 1;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,(long)local_240.size * 0x10c);
    }
    local_240.items[local_240.icount].id = 3;
    local_240.items[local_240.icount].role = MI_NORMAL;
    local_240.items[local_240.icount].accel = 'n';
    local_240.items[local_240.icount].group_accel = '\0';
    local_240.items[local_240.icount].selected = '\0';
    builtin_strncpy(local_240.items[local_240.icount].caption,"Name all items o",0x10);
    builtin_strncpy(local_240.items[local_240.icount].caption + 0x10,"f a certain type",0x10);
    local_240.items[local_240.icount].caption[0x20] = '\0';
    local_240.icount = local_240.icount + 1;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,(long)local_240.size * 0x10c);
    }
    local_240.items[local_240.icount].id = 4;
    local_240.items[local_240.icount].role = MI_NORMAL;
    local_240.items[local_240.icount].accel = 'f';
    local_240.items[local_240.icount].group_accel = '\0';
    local_240.items[local_240.icount].selected = '\0';
    builtin_strncpy(local_240.items[local_240.icount].caption,"Annotate this le",0x10);
    builtin_strncpy(local_240.items[local_240.icount].caption + 0x10,"vel",4);
    iVar10 = local_240.icount + 1;
    pnVar9 = local_240.items;
    local_240.icount = iVar10;
LAB_0017ce18:
    iVar10 = display_menu(pnVar9,iVar10,local_128,1,&local_22c);
    free(local_240.items);
    if (iVar10 == 0) {
      return 0;
    }
  }
  else {
    pcVar4 = simple_typename((int)obj->otyp);
    if ((obj->quan < 2) && (obj->oartifact != '\x1d')) {
      pcVar7 = "";
    }
    else {
      pcVar4 = makeplural(pcVar4);
      pcVar7 = "stack of ";
    }
    snprintf(local_128,0x80,"Name this individual %s%s?",pcVar7,pcVar4);
    lVar8 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar8 * 0x218);
    }
    pnVar9 = local_240.items + local_240.icount;
    pnVar9->id = 2;
    pnVar9->role = MI_NORMAL;
    pnVar9->accel = 'y';
    pnVar9->group_accel = '\0';
    pnVar9->selected = '\0';
    if (obj->quan < 2) {
      pcVar4 = "Yes, just this item";
      if (obj->oartifact == '\x1d') {
        pcVar4 = "Yes, just this stack";
      }
    }
    else {
      pcVar4 = "Yes, just this stack";
    }
    strcpy(pnVar9->caption,pcVar4);
    local_240.icount = local_240.icount + 1;
    lVar8 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar8 * 0x218);
    }
    pnVar9 = local_240.items;
    local_240.items[local_240.icount].id = 3;
    local_240.items[local_240.icount].role = MI_NORMAL;
    local_240.items[local_240.icount].accel = 'n';
    local_240.items[local_240.icount].group_accel = '\0';
    local_240.items[local_240.icount].selected = '\0';
    builtin_strncpy(local_240.items[local_240.icount].caption,"No, call all ite",0x10);
    builtin_strncpy(local_240.items[local_240.icount].caption + 0x10,"ms of this type",0x10);
    iVar10 = local_240.icount + 1;
    local_240.icount = iVar10;
    pvVar5 = memchr("\t\b\v\x04\x05\r\n\x03\x06",(int)obj->oclass,10);
    if (pvVar5 != (void *)0x0) goto LAB_0017ce18;
    local_22c = 2;
    free(pnVar9);
  }
  switch(local_22c) {
  case 1:
    do_mname();
    break;
  case 2:
    if ((obj == (obj *)0x0) &&
       (obj = getobj("\x02\x03\x04\x05\x06\a\b\t\n\v\r\x0e\x0f\x10\x11","name",(obj **)0x0),
       obj == (obj *)0x0)) {
      return 0;
    }
    pcVar4 = simple_typename((int)obj->otyp);
    if (obj->quan < 2) {
      pcVar7 = "this";
      if (obj->oartifact == '\x1d') {
        pcVar7 = "these";
      }
    }
    else {
      pcVar7 = "these";
    }
    planA = xname(obj);
    if ((obj->quan < 2) && (obj->oartifact != '\x1d')) {
      last_resort = "thing";
    }
    else {
      pcVar4 = makeplural(pcVar4);
      if (obj->quan < 2) {
        last_resort = "thing";
        if (obj->oartifact == '\x1d') {
          last_resort = "things";
        }
      }
      else {
        last_resort = "things";
      }
    }
    pcVar4 = safe_qbuf("",0x21,planA,pcVar4,last_resort);
    sprintf(local_a8,"What do you want to name %s %s?",pcVar7,pcVar4);
    getlin(local_a8,local_228);
    if (local_228[0] == '\0') {
      return 0;
    }
    if (local_228[0] == '\x1b') {
      return 0;
    }
    mungspaces(local_228);
    pcVar4 = artifact_name(local_228,&local_22e);
    if ((pcVar4 != (char *)0x0) && (local_22e == obj->otyp)) {
      strcpy(local_228,pcVar4);
    }
    if (obj->oartifact == '\0') {
      bVar1 = restrict_name(obj,local_228,'\0');
      if ((bVar1 != '\0') || (bVar1 = exist_artifact((int)obj->otyp,local_228), bVar1 != '\0')) {
        sVar6 = strlen(local_228);
        uVar3 = mt_random();
        lVar8 = SUB168(ZEXT416(uVar3) % SEXT816((long)(int)sVar6),0);
        cVar2 = lowc(local_228[lVar8]);
        do {
          uVar3 = mt_random();
          c = (char)uVar3 + (char)(uVar3 / 0x19) * -0x19 + 'a';
        } while (cVar2 == c);
        if (local_228[lVar8] != cVar2) {
          c = highc(c);
        }
        local_228[lVar8] = c;
        pcVar4 = body_part(6);
        pline("While engraving your %s slips.",pcVar4);
        (*windowprocs.win_pause)(P_MESSAGE);
        pline("You engrave: \"%s\".",local_228);
      }
      oname(obj,local_228);
      return 0;
    }
    pcVar4 = "The artifact seems to resist the attempt.";
    goto LAB_0017d018;
  case 3:
    if ((obj == (obj *)0x0) &&
       (obj = getobj("\t\b\v\x04\x05\r\n\x03\x06","call",(obj **)0x0), obj == (obj *)0x0)) {
      return 0;
    }
    examine_object(obj);
    if ((obj->field_0x4a & 0x20) != 0) {
      docall(obj);
      return 0;
    }
    pcVar4 = "You would never recognize another one.";
LAB_0017d018:
    pline(pcVar4);
    break;
  case 4:
    donamelevel();
  }
  return 0;
}

Assistant:

int do_naming(struct obj *obj)
{
	int n, selected[1];
	struct menulist menu;
	char title[QBUFSZ];

	init_menulist(&menu);

	if (obj) {
	    char *otypname = simple_typename(obj->otyp);
	    snprintf(title, QBUFSZ, "Name this individual %s%s?",
		     is_plural(obj) ? "stack of " : "",
		     is_plural(obj) ? makeplural(otypname) : otypname);
	    add_menuitem(&menu, 2, is_plural(obj) ? "Yes, just this stack" :
						    "Yes, just this item",
			 'y', FALSE);
	    add_menuitem(&menu, 3, "No, call all items of this type", 'n', FALSE);
	} else {
	    snprintf(title, QBUFSZ, "What do you wish to name?");
	    add_menuitem(&menu, 1, "Name a monster", 'C', FALSE);
	    add_menuitem(&menu, 2, "Name an individual item", 'y', FALSE);
	    add_menuitem(&menu, 3, "Name all items of a certain type", 'n', FALSE);
	    add_menuitem(&menu, 4, "Annotate this level", 'f', FALSE);
	}

	if (!obj || strchr(callable, obj->oclass)) {
	    n = display_menu(menu.items, menu.icount, title, PICK_ONE, selected);
	} else {
	    /* simulate choice to name individual item automatically */
	    n = 1;
	    selected[0] = 2;	/* name one */
	}

	free(menu.items);
	if (n)
	    n = selected[0] - 1;
	else
	    return 0;

	switch (n) {
	    default: break;
	    case 0:
		do_mname();
		break;
	    case 1:
		do_oname(obj);
		break;
	    case 2:
		do_tname(obj);
		break;
	    case 3:
		donamelevel();
		break;
	}
	return 0;
}